

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>::
num_writer::operator()(num_writer *this,char *it)

{
  undefined1 value [16];
  anon_class_40_4_2c7d0318 add_thousands_sep;
  char *pcVar1;
  size_t __n;
  int digit_index;
  const_iterator group;
  char buffer [78];
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff60;
  char local_68 [80];
  
  if (-1 < *(int *)(this + 0x10)) {
    value._8_8_ = this + 0x20;
    value._0_8_ = this;
    add_thousands_sep.s.data_ = &stack0xffffffffffffff68;
    add_thousands_sep.this = (num_writer *)0x1;
    add_thousands_sep.s.size_ = (size_t)&stack0xffffffffffffff64;
    add_thousands_sep.group._0_4_ = in_stack_ffffffffffffff60;
    add_thousands_sep.group._4_4_ = 0;
    add_thousands_sep.digit_index = (int *)**(undefined8 **)(this + 0x18);
    pcVar1 = detail::operator()(local_68,(unsigned___int128)value,(int)*(undefined8 *)this,
                                add_thousands_sep);
    __n = (long)pcVar1 - (long)local_68;
    if (__n != 0) {
      memcpy(it,local_68,__n);
    }
    return it + __n;
  }
  assert_fail(in_stack_ffffffffffffff40,0,in_stack_ffffffffffffff38);
}

Assistant:

It operator()(It it) const {
      basic_string_view<Char> s(&sep, sep_size);
      // Index of a decimal digit with the least significant digit having
      // index 0.
      int digit_index = 0;
      std::string::const_iterator group = groups.cbegin();
      return format_decimal<Char>(
          it, abs_value, size, [this, s, &group, &digit_index](Char*& buffer) {
            if (*group <= 0 || ++digit_index % *group != 0 ||
                *group == max_value<char>())
              return;
            if (group + 1 != groups.cend()) {
              digit_index = 0;
              ++group;
            }
            buffer -= s.size();
            std::uninitialized_copy(s.data(), s.data() + s.size(),
                                    make_checked(buffer, s.size()));
          });
    }